

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O2

void __thiscall QMakeGlobals::~QMakeGlobals(QMakeGlobals *this)

{
  long lVar1;
  
  qDeleteAll<QHash<QMakeBaseKey,QMakeBaseEnv*>>(&this->baseEnvs);
  QHash<QMakeBaseKey,_QMakeBaseEnv_*>::~QHash(&this->baseEnvs);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->build_root).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->source_root).d);
  lVar1 = 0;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)((long)&this->extra_cmds[3].d.d + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->user_template_prefix).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->user_template).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->xqmakespec).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->qmakespec).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->qtconf).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->qmake_extra_args).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->qmake_args).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->qmake_abslocation).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->cachefile).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->dirlist_sep).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->dir_sep).d);
  return;
}

Assistant:

QMakeGlobals::~QMakeGlobals()
{
    qDeleteAll(baseEnvs);
}